

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

gs_expr_t * gs_parse_expr_assignment(gs_parser_t *parser)

{
  gs_token_t *pgVar1;
  anon_union_8_5_f029217d_for_gs_token_3 aVar2;
  gs_token_type gVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  _Bool _Var7;
  gs_expr_t *pgVar8;
  gs_expr_t *pgVar9;
  gs_expr_t *pgVar10;
  gs_token_t token;
  
  pgVar1 = (parser->tokens).data;
  aVar2 = pgVar1[parser->cur_token].field_3;
  pgVar1 = pgVar1 + parser->cur_token;
  gVar3 = pgVar1->type;
  iVar4 = pgVar1->line;
  iVar5 = pgVar1->col;
  uVar6 = *(undefined4 *)&pgVar1->field_0xc;
  pgVar8 = gs_parse_expr_comparison(parser);
  if (parser->error == false) {
    while ((_Var7 = gs_eat_char(parser,'='), _Var7 &&
           (pgVar9 = gs_parse_expr_assignment(parser), parser->error == false))) {
      pgVar10 = (gs_expr_t *)gs_parser_alloc(parser,0x40);
      pgVar10->type = GS_EXPR_ASSIGNMENT;
      (pgVar10->token).type = gVar3;
      (pgVar10->token).line = iVar4;
      (pgVar10->token).col = iVar5;
      *(undefined4 *)&(pgVar10->token).field_0xc = uVar6;
      (pgVar10->token).field_3 = aVar2;
      (pgVar10->field_2).assignment.left = pgVar8;
      (pgVar10->field_2).binary_op.left = pgVar9;
      pgVar8 = pgVar10;
    }
  }
  return pgVar8;
}

Assistant:

static gs_expr_t *gs_parse_expr_assignment(gs_parser_t *parser) {
    gs_token_t token = gs_peek(parser);
    gs_expr_t *expr = gs_parse_expr_comparison(parser);
    if (parser->error) goto cleanup;

    while (true) {
        if (gs_eat_char(parser, '=')) {
            gs_expr_t *right = gs_parse_expr_assignment(parser);
            if (parser->error) goto cleanup;

            expr = gs_expr_assignment_new(parser, token, expr, right);
        }
        else {
            break;
        }
    }

cleanup:
    return expr;
}